

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_node_pair_set_key(fy_node_pair *fynp,fy_node *fyn)

{
  fy_node *fyn_00;
  _Bool _Var1;
  fy_node_pair *pfVar2;
  fy_node_pair *local_30;
  fy_node_pair *fynpi;
  fy_node *fyn_map;
  fy_node *fyn_local;
  fy_node_pair *fynp_local;
  
  if (fynp == (fy_node_pair *)0x0) {
    fynp_local._4_4_ = -1;
  }
  else if ((fyn == (fy_node *)0x0) || (((byte)fyn->field_0x34 >> 3 & 1) == 0)) {
    fyn_00 = fynp->parent;
    if (fyn_00 != (fy_node *)0x0) {
      _Var1 = fy_node_is_mapping(fyn_00);
      if (!_Var1) {
        return -1;
      }
      if (fyn_00->xl == (fy_accel *)0x0) {
        for (local_30 = fy_node_pair_list_head(&(fyn_00->field_12).mapping);
            local_30 != (fy_node_pair *)0x0;
            local_30 = fy_node_pair_next(&(fyn_00->field_12).mapping,local_30)) {
          if ((local_30 != fynp) && (_Var1 = fy_node_compare(local_30->key,fyn), _Var1)) {
            return -1;
          }
        }
      }
      else {
        pfVar2 = fy_node_accel_lookup_by_node(fyn_00,fyn);
        if ((pfVar2 != (fy_node_pair *)0x0) && (pfVar2 != fynp)) {
          return -1;
        }
        fy_accel_remove(fyn_00->xl,fynp->key);
      }
      fy_node_mark_synthetic(fyn_00);
    }
    fy_node_detach_and_free(fynp->key);
    fynp->key = fyn;
    if ((fyn_00 != (fy_node *)0x0) && (fyn_00->xl != (fy_accel *)0x0)) {
      fy_accel_insert(fyn_00->xl,fynp->key,fynp);
    }
    fyn->field_0x34 = fyn->field_0x34 & 0xf7 | 8;
    fynp_local._4_4_ = 0;
  }
  else {
    fynp_local._4_4_ = -1;
  }
  return fynp_local._4_4_;
}

Assistant:

int fy_node_pair_set_key(struct fy_node_pair *fynp, struct fy_node *fyn) {
    struct fy_node *fyn_map;
    struct fy_node_pair *fynpi;

    if (!fynp)
        return -1;

    /* the node must not be attached */
    if (fyn && fyn->attached)
        return -1;

    /* sanity check and duplication check */
    fyn_map = fynp->parent;
    if (fyn_map) {

        /* (in)sanity check */
        if (!fy_node_is_mapping(fyn_map))
            return -1;

        if (fyn_map->xl) {
            /* either we're already on the parent list (and it's OK) */
            /* or we're not and we have a duplicate key */
            fynpi = fy_node_accel_lookup_by_node(fyn_map, fyn);
            if (fynpi && fynpi != fynp)
                return -1;
            /* remove that key */
            fy_accel_remove(fyn_map->xl, fynp->key);
        } else {
            /* check whether the key is a duplicate
			* skipping ourselves since our key gets replaced
			*/
            for (fynpi = fy_node_pair_list_head(&fyn_map->mapping); fynpi;
                 fynpi = fy_node_pair_next(&fyn_map->mapping, fynpi)) {

                if (fynpi != fynp && fy_node_compare(fynpi->key, fyn))
                    return -1;
            }
        }

        fy_node_mark_synthetic(fyn_map);
    }

    fy_node_detach_and_free(fynp->key);
    fynp->key = fyn;

    if (fyn_map && fyn_map->xl)
        fy_accel_insert(fyn_map->xl, fynp->key, fynp);

    fyn->attached = true;

    return 0;
}